

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O3

bool __thiscall draco::MetadataDecoder::DecodeName(MetadataDecoder *this,string *name)

{
  long lVar1;
  byte bVar2;
  DecoderBuffer *pDVar3;
  ulong __n;
  
  pDVar3 = this->buffer_;
  lVar1 = pDVar3->pos_ + 1;
  if (lVar1 <= pDVar3->data_size_) {
    bVar2 = pDVar3->data_[pDVar3->pos_];
    __n = (ulong)bVar2;
    pDVar3->pos_ = lVar1;
    std::__cxx11::string::resize((ulong)name,bVar2);
    if (__n == 0) {
      return true;
    }
    if (name->_M_string_length == 0) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    pDVar3 = this->buffer_;
    if ((long)(pDVar3->pos_ + __n) <= pDVar3->data_size_) {
      memcpy((name->_M_dataplus)._M_p,pDVar3->data_ + pDVar3->pos_,__n);
      pDVar3->pos_ = pDVar3->pos_ + __n;
      return true;
    }
  }
  return false;
}

Assistant:

bool MetadataDecoder::DecodeName(std::string *name) {
  uint8_t name_len = 0;
  if (!buffer_->Decode(&name_len)) {
    return false;
  }
  name->resize(name_len);
  if (name_len == 0) {
    return true;
  }
  if (!buffer_->Decode(&name->at(0), name_len)) {
    return false;
  }
  return true;
}